

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O2

Part_Key_Store_Data * Part_Key_Store_Data::Narrow(Am_Wrapper *value)

{
  int iVar1;
  
  if ((value != (Am_Wrapper *)0x0) &&
     (iVar1 = (**(value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(),
     (Am_ID_Tag)iVar1 == id)) {
    return (Part_Key_Store_Data *)value;
  }
  return (Part_Key_Store_Data *)0x0;
}

Assistant:

static Am_Value
from_part_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Store_Data *store =
      (Part_Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = self.Get_Object(store->part).Get(store->key);
  store->Release();
  return value;
}